

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

int __thiscall
gl4cts::GPUShaderFP64Test3::programInfo::link(programInfo *this,char *__from,char *__to)

{
  ostringstream *this_00;
  deUint32 dVar1;
  int extraout_EAX;
  long lVar2;
  MessageBuilder *this_01;
  TestError *this_02;
  GLint length;
  vector<char,_std::allocator<char>_> message;
  GLint status;
  vector<char,_std::allocator<char>_> local_1d8;
  int local_1b4;
  pointer local_1b0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  lVar2 = (**(code **)(**(long **)(__from + 8) + 0x18))();
  local_1b4 = 0;
  (**(code **)(lVar2 + 0x10))(this->m_program_object_id,this->m_fragment_shader_id);
  (**(code **)(lVar2 + 0x10))(this->m_program_object_id,this->m_geometry_shader_id);
  (**(code **)(lVar2 + 0x10))(this->m_program_object_id,this->m_tesselation_control_shader_id);
  (**(code **)(lVar2 + 0x10))(this->m_program_object_id,this->m_tesselation_evaluation_shader_id);
  (**(code **)(lVar2 + 0x10))(this->m_program_object_id,this->m_vertex_shader_id);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"AttachShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1391);
  (**(code **)(lVar2 + 0xce8))(this->m_program_object_id);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1395);
  (**(code **)(lVar2 + 0x9d8))(this->m_program_object_id,0x8b82,&local_1b4);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1399);
  if (local_1b4 == 1) {
    return extraout_EAX;
  }
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar2 + 0x9d8))(this->m_program_object_id,0x8b84);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x13a3);
  std::vector<char,_std::allocator<char>_>::resize(&local_1d8,0);
  (**(code **)(lVar2 + 0x988))
            (this->m_program_object_id,0,0,
             local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x13a9);
  local_1a8._0_8_ = *(undefined8 *)(*(long *)__from + 0x10);
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Failed to link program:\n",0x18);
  local_1b0 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&local_1b0);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to link program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x13af);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShaderFP64Test3::programInfo::link(deqp::Context& context) const
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Link status */
	glw::GLint status = GL_FALSE;

	/* Attach shaders */
	gl.attachShader(m_program_object_id, m_fragment_shader_id);
	gl.attachShader(m_program_object_id, m_geometry_shader_id);
	gl.attachShader(m_program_object_id, m_tesselation_control_shader_id);
	gl.attachShader(m_program_object_id, m_tesselation_evaluation_shader_id);
	gl.attachShader(m_program_object_id, m_vertex_shader_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");

	/* Link */
	gl.linkProgram(m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(m_program_object_id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Get error log length */
		gl.getProgramiv(m_program_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length);

		/* Get error log */
		gl.getProgramInfoLog(m_program_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		/* Log */
		context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to link program:\n"
										  << &message[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Failed to link program");
	}
}